

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagecontrol.cpp
# Opt level: O3

void __thiscall
QtMWidgets::PageControlPrivate::PageControlPrivate(PageControlPrivate *this,PageControl *parent)

{
  this->q = parent;
  this->count = 0;
  this->currentIndex = -1;
  (this->pageIndicatorColor).cspec = Invalid;
  (this->pageIndicatorColor).ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(this->pageIndicatorColor).ct + 2) = 0;
  (this->currentPageIndicatorColor).cspec = Invalid;
  (this->currentPageIndicatorColor).ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(this->currentPageIndicatorColor).ct + 2) = 0;
  this->radius = 0;
  this->smallRadius = 0;
  this->buttonSize = 0;
  this->linesCount = 0;
  this->linesCount = 0;
  this->countInOneLine = 0;
  this->countInLastLine = 0;
  this->widgetWidth = 0;
  (this->rectangles).d.d = (Data *)0x0;
  (this->rectangles).d.ptr = (QRect *)0x0;
  (this->rectangles).d.size = 0;
  (this->clickPos).xp = 0;
  (this->clickPos).yp = 0;
  this->leftButtonPressed = false;
  init(this,(EVP_PKEY_CTX *)parent);
  return;
}

Assistant:

PageControlPrivate( PageControl * parent )
		:	q( parent )
		,	count( 0 )
		,	currentIndex( -1 )
		,	radius( 0 )
		,	smallRadius( 0 )
		,	buttonSize( 0 )
		,	linesCount( 0 )
		,	countInOneLine( 0 )
		,	countInLastLine( 0 )
		,	widgetWidth( 0 )
		,	leftButtonPressed( false )
	{
		init();
	}